

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Codec.h
# Opt level: O2

ssize_t __thiscall
sznet::net::LengthHeaderCodec<std::shared_ptr<sznet::net::TcpConnection>_>::send
          (LengthHeaderCodec<std::shared_ptr<sznet::net::TcpConnection>_> *this,int __fd,void *__buf
          ,size_t __n,int __flags)

{
  ssize_t extraout_RAX;
  void *__buf_00;
  undefined4 in_register_00000034;
  undefined1 local_60 [8];
  Buffer buf;
  int32_t len;
  
  Buffer::Buffer((Buffer *)local_60,4,0x400);
  Buffer::append((Buffer *)local_60,*__buf,(long)*(int *)((long)__buf + 8));
  buf.m_wrapSize._4_4_ = *(undefined4 *)((long)__buf + 8);
  Buffer::prepend((Buffer *)local_60,(void *)((long)&buf.m_wrapSize + 4),4);
  TcpConnection::send((TcpConnection *)CONCAT44(in_register_00000034,__fd),(int)(Buffer *)local_60,
                      __buf_00,__n,__flags);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&buf);
  return extraout_RAX;
}

Assistant:

void send(TPTR* conn, const StringPiece& message)
	{
		Buffer buf;
		buf.append(message.data(), message.size());
		int32_t len = static_cast<int32_t>(message.size());
		buf.prepend(&len, sizeof(len));
		conn->send(&buf);
	}